

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O2

bool __thiscall cmCTestSVN::UpdateParser::ProcessLine(UpdateParser *this)

{
  RegularExpression *this_00;
  char path_status;
  char prop_status;
  bool bVar1;
  string local_80;
  string local_60;
  string local_40;
  
  this_00 = &this->RegexUpdate;
  bVar1 = cmsys::RegularExpression::find(this_00,&(this->super_LineParser).Line);
  if (bVar1) {
    cmsys::RegularExpressionMatch::match_abi_cxx11_(&local_40,&this_00->regmatch,1);
    path_status = *local_40._M_dataplus._M_p;
    cmsys::RegularExpressionMatch::match_abi_cxx11_(&local_60,&this_00->regmatch,2);
    prop_status = *local_60._M_dataplus._M_p;
    cmsys::RegularExpressionMatch::match_abi_cxx11_(&local_80,&this_00->regmatch,3);
    DoPath(this,path_status,prop_status,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return true;
}

Assistant:

bool ProcessLine() override
  {
    if (this->RegexUpdate.find(this->Line)) {
      this->DoPath(this->RegexUpdate.match(1)[0],
                   this->RegexUpdate.match(2)[0], this->RegexUpdate.match(3));
    }
    return true;
  }